

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O3

void __thiscall hiberlite::Database::registerBeanClass<Person>(Database *this)

{
  int *piVar1;
  ModelExtractor *pMVar2;
  string classname;
  shared_connection local_40;
  undefined1 *local_30;
  undefined1 local_20 [16];
  
  if (this->mx == (ModelExtractor *)0x0) {
    pMVar2 = (ModelExtractor *)operator_new(0xf0);
    ModelExtractor::ModelExtractor(pMVar2);
    this->mx = pMVar2;
  }
  getClassName<Person>();
  pMVar2 = this->mx;
  local_40._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_40.res = (this->con).res;
  if (local_40.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_40.res)->refCount = (local_40.res)->refCount + 1;
  }
  ModelExtractor::extractModel<Person>(pMVar2,&local_40);
  local_40._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_40.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_40.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_40.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

inline void Database::registerBeanClass()
{
	if(!mx)
		mx=new ModelExtractor();
	std::string classname=Database::getClassName<C>();

	mx->extractModel<C>(con);
}